

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.cpp
# Opt level: O2

Config * __thiscall Jupiter::Config::getSection(Config *this,string_view in_key)

{
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Jupiter::Config>,std::allocator<std::pair<std::__cxx11::string_const,Jupiter::Config>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *this_00;
  iterator iVar1;
  Config *pCVar2;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_10._M_str = in_key._M_str;
  local_10._M_len = in_key._M_len;
  this_00 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Jupiter::Config>,std::allocator<std::pair<std::__cxx11::string_const,Jupiter::Config>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
             *)(this->m_sections)._M_t.
               super___uniq_ptr_impl<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>_*,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>_>_>
               .
               super__Head_base<0UL,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>_*,_false>
               ._M_head_impl;
  if (this_00 ==
      (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Jupiter::Config>,std::allocator<std::pair<std::__cxx11::string_const,Jupiter::Config>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
       *)0x0) {
    pCVar2 = (Config *)0x0;
  }
  else {
    iVar1 = std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Jupiter::Config>,std::allocator<std::pair<std::__cxx11::string_const,Jupiter::Config>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void,void>
                      (this_00,&local_10);
    pCVar2 = (Config *)
             ((long)iVar1.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>,_false>
                    ._M_cur + 0x28);
    if (iVar1.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>,_false>
        ._M_cur == (__node_type *)0x0) {
      pCVar2 = (Config *)0x0;
    }
  }
  return pCVar2;
}

Assistant:

Jupiter::Config *Jupiter::Config::getSection(std::string_view in_key) const {
	if (m_sections != nullptr) {
		auto section = m_sections->find(JUPITER_WRAP_MAP_KEY(in_key));
		if (section != m_sections->end()) {
			return &section->second;
		}
	}

	return nullptr;
}